

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O2

void __thiscall isSameTopology::test_method(isSameTopology *this)

{
  shared_count sStack_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined **local_4a0;
  undefined1 local_498;
  undefined8 *local_490;
  char **local_488;
  S2 s2;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  RealSpace R9;
  RealSpace R3;
  RealSpace R9b;
  SO3<mnf::ExpMapMatrix> so3;
  CartesianProduct cp;
  
  mnf::RealSpace::RealSpace(&R9,9);
  mnf::RealSpace::RealSpace(&R9b,9);
  mnf::RealSpace::RealSpace(&R3,3);
  mnf::S2::S2(&s2);
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&so3);
  mnf::CartesianProduct::CartesianProduct(&cp,&so3.super_Manifold,(Manifold *)&R9);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e8,0xf5);
  mnf::S2::isSameTopology((Manifold *)&s2);
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = "!s2.isSameTopology(R9)";
  local_4a8 = "";
  local_498 = 0;
  local_4a0 = &PTR__lazy_ostream_00137c98;
  local_490 = &boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_300 = "";
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_318,0xf6);
  mnf::S2::isSameTopology((Manifold *)&s2);
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = "!s2.isSameTopology(R9b)";
  local_4a8 = "";
  local_498 = 0;
  local_4a0 = &PTR__lazy_ostream_00137c98;
  local_490 = &boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_330 = "";
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_348,0xf7);
  mnf::S2::isSameTopology((Manifold *)&s2);
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = "!s2.isSameTopology(R3)";
  local_4a8 = "";
  local_498 = 0;
  local_4a0 = &PTR__lazy_ostream_00137c98;
  local_490 = &boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_360 = "";
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_378,0xf8);
  mnf::S2::isSameTopology((Manifold *)&s2);
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = "s2.isSameTopology(s2)";
  local_4a8 = "";
  local_498 = 0;
  local_4a0 = &PTR__lazy_ostream_00137c98;
  local_490 = &boost::unit_test::lazy_ostream::inst;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_390 = "";
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a8,0xf9);
  mnf::S2::isSameTopology((Manifold *)&s2);
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = "!s2.isSameTopology(so3)";
  local_4a8 = "";
  local_498 = 0;
  local_4a0 = &PTR__lazy_ostream_00137c98;
  local_490 = &boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_3c0 = "";
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_3d0 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d8,0xfa);
  mnf::S2::isSameTopology((Manifold *)&s2);
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = "!s2.isSameTopology(cp)";
  local_4a8 = "";
  local_498 = 0;
  local_4a0 = &PTR__lazy_ostream_00137c98;
  local_490 = &boost::unit_test::lazy_ostream::inst;
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  mnf::CartesianProduct::~CartesianProduct(&cp);
  mnf::SO3<mnf::ExpMapMatrix>::~SO3(&so3);
  mnf::Manifold::~Manifold((Manifold *)&s2);
  mnf::RealSpace::~RealSpace(&R3);
  mnf::RealSpace::~RealSpace(&R9b);
  mnf::RealSpace::~RealSpace(&R9);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(isSameTopology)
{
  RealSpace R9(9);
  RealSpace R9b(9);
  RealSpace R3(3);
  S2 s2;
  SO3<ExpMapMatrix> so3;
  CartesianProduct cp(so3, R9);

  BOOST_CHECK(!s2.isSameTopology(R9));
  BOOST_CHECK(!s2.isSameTopology(R9b));
  BOOST_CHECK(!s2.isSameTopology(R3));
  BOOST_CHECK(s2.isSameTopology(s2));
  BOOST_CHECK(!s2.isSameTopology(so3));
  BOOST_CHECK(!s2.isSameTopology(cp));
}